

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_io_thread.cpp
# Opt level: O3

int __thiscall
libtorrent::disk_io_thread::flush_range
          (disk_io_thread *this,cached_piece_entry *pe,int start,int end,jobqueue_t *completed_jobs,
          unique_lock<std::mutex> *l)

{
  long lVar1;
  bool bVar2;
  int num;
  ulong uVar3;
  unique_lock<std::mutex> *puVar4;
  span<char> *__s;
  uint uVar5;
  long TORRENT_ALLOCA_size;
  int *flushing;
  span<const_libtorrent::span<char>_> iov;
  span<libtorrent::span<char>_> iov_00;
  span<const_int> flushing_00;
  int aiStack_a0 [2];
  span<int> sStack_98;
  ulong uStack_88;
  long lStack_80;
  span<char> sStack_78;
  ulong uStack_68;
  undefined1 local_60 [8];
  storage_error error;
  
  error._16_8_ = completed_jobs;
  uVar5 = *(uint *)&pe->field_0x80 & 0x3fff;
  uVar3 = (ulong)uVar5;
  lVar1 = -(ulong)(uVar5 << 4);
  __s = (span<char> *)((long)&sStack_78 + lVar1);
  puVar4 = l;
  if (uVar3 != 0) {
    *(undefined8 *)((long)&lStack_80 + lVar1) = 0x3284e1;
    memset(__s,0,(ulong)(uVar5 << 4));
  }
  flushing = (int *)((long)__s - (ulong)(uVar5 * 4 + 0xf & 0xfffffff0));
  sStack_78.m_len = (difference_type)flushing;
  uStack_68 = uVar3;
  *(int **)(flushing + -8) = flushing;
  *(ulong *)(flushing + -6) = uVar3;
  flushing[-4] = 0;
  flushing[-10] = 0x32852f;
  flushing[-9] = 0;
  iov_00.m_len = (difference_type)puVar4;
  iov_00.m_ptr = __s;
  uVar5 = build_iovec(this,pe,start,end,iov_00,*(span<int> *)(flushing + -8),flushing[-4]);
  if (uVar5 != 0) {
    local_60._0_4_ = 0;
    local_60[4] = false;
    error.ec._0_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
    error.ec.cat_._0_4_ = 0xffffff;
    uVar3 = *(ulong *)&pe->field_0x7c + 0x20000000000000 & 0xfe0000000000000;
    *(ulong *)&pe->field_0x7c = *(ulong *)&pe->field_0x7c & 0xf01fffffffffffff | uVar3;
    flushing[-2] = 0x32859a;
    flushing[-1] = 0;
    std::unique_lock<std::mutex>::unlock(l);
    *(undefined1 **)(flushing + -2) = local_60;
    *(ulong *)(flushing + -4) = (ulong)uVar5;
    flushing[-6] = 0x3285b6;
    flushing[-5] = 0;
    iov.m_len = uVar3;
    iov.m_ptr = __s;
    flushing_00.m_len = (difference_type)puVar4;
    flushing_00.m_ptr = flushing;
    flush_iovec(this,pe,iov,flushing_00,flushing[-4],*(storage_error **)(flushing + -2));
    flushing[-2] = 0x3285c3;
    flushing[-1] = 0;
    anon_unknown_0::scoped_unlocker_impl<std::unique_lock<std::mutex>_>::~scoped_unlocker_impl
              ((scoped_unlocker_impl<std::unique_lock<std::mutex>_> *)l);
    *(ulong *)&pe->field_0x7c =
         *(ulong *)&pe->field_0x7c & 0xf01fffffffffffff |
         *(ulong *)&pe->field_0x7c + 0xfe0000000000000 & 0xfe0000000000000;
    *(undefined8 *)(flushing + -4) = error._16_8_;
    flushing[-6] = 0x328601;
    flushing[-5] = 0;
    bVar2 = iovec_flushed(this,pe,flushing,uVar5,0,(storage_error *)local_60,
                          *(jobqueue_t **)(flushing + -4));
    if (!bVar2) {
      flushing[-2] = 0x32861b;
      flushing[-1] = 0;
      block_cache::maybe_free_piece(&this->m_disk_cache,pe);
    }
    flushing[-2] = 0x32862c;
    flushing[-1] = 0;
    num = disk_buffer_pool::num_to_evict(&(this->m_disk_cache).super_disk_buffer_pool,0);
    if (0 < num) {
      flushing[-2] = 0x32863c;
      flushing[-1] = 0;
      block_cache::try_evict_blocks(&this->m_disk_cache,num,(cached_piece_entry *)0x0);
    }
  }
  return uVar5;
}

Assistant:

int disk_io_thread::flush_range(cached_piece_entry* pe, int const start, int const end
		, jobqueue_t& completed_jobs, std::unique_lock<std::mutex>& l)
	{
		TORRENT_ASSERT(l.owns_lock());

		DLOG("flush_range: piece=%d [%d, %d)\n"
			, static_cast<int>(pe->piece), start, end);
		TORRENT_PIECE_ASSERT(start >= 0, pe);
		TORRENT_PIECE_ASSERT(start < end, pe);

		TORRENT_ALLOCA(iov, iovec_t, pe->blocks_in_piece);
		TORRENT_ALLOCA(flushing, int, pe->blocks_in_piece);
		int const iov_len = build_iovec(pe, start, end, iov, flushing, 0);
		if (iov_len == 0) return 0;

		TORRENT_PIECE_ASSERT(pe->cache_state <= cached_piece_entry::read_lru1 || pe->cache_state == cached_piece_entry::read_lru2, pe);
#if TORRENT_USE_ASSERTS
		pe->piece_log.push_back(piece_log_t(piece_log_t::flush_range, -1));
#endif

		storage_error error;
		{
			piece_refcount_holder refcount_holder(pe);
			auto unlocker = scoped_unlock(l);

			flush_iovec(pe, iov, flushing, iov_len, error);
		}

		if (!iovec_flushed(pe, flushing.data(), iov_len, 0, error, completed_jobs))
			m_disk_cache.maybe_free_piece(pe);

		// if the cache is under high pressure, we need to evict
		// the blocks we just flushed to make room for more write pieces
		int const evict = m_disk_cache.num_to_evict(0);
		if (evict > 0) m_disk_cache.try_evict_blocks(evict);

		return iov_len;
	}